

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::AdamOptimizer::Clear(AdamOptimizer *this)

{
  if (this->learningrate_ != (DoubleParameter *)0x0) {
    (*(this->learningrate_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->learningrate_ = (DoubleParameter *)0x0;
  if (this->minibatchsize_ != (Int64Parameter *)0x0) {
    (*(this->minibatchsize_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->minibatchsize_ = (Int64Parameter *)0x0;
  if (this->beta1_ != (DoubleParameter *)0x0) {
    (*(this->beta1_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->beta1_ = (DoubleParameter *)0x0;
  if (this->beta2_ != (DoubleParameter *)0x0) {
    (*(this->beta2_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->beta2_ = (DoubleParameter *)0x0;
  if (this->eps_ != (DoubleParameter *)0x0) {
    (*(this->eps_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->eps_ = (DoubleParameter *)0x0;
  return;
}

Assistant:

void AdamOptimizer::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.AdamOptimizer)
  if (GetArenaNoVirtual() == NULL && learningrate_ != NULL) {
    delete learningrate_;
  }
  learningrate_ = NULL;
  if (GetArenaNoVirtual() == NULL && minibatchsize_ != NULL) {
    delete minibatchsize_;
  }
  minibatchsize_ = NULL;
  if (GetArenaNoVirtual() == NULL && beta1_ != NULL) {
    delete beta1_;
  }
  beta1_ = NULL;
  if (GetArenaNoVirtual() == NULL && beta2_ != NULL) {
    delete beta2_;
  }
  beta2_ = NULL;
  if (GetArenaNoVirtual() == NULL && eps_ != NULL) {
    delete eps_;
  }
  eps_ = NULL;
}